

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O0

void pack_reg(__m128i *in1,__m128i *in2,__m256i *out)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  __m256i alVar4;
  __m256i *out_local;
  __m128i *in2_local;
  __m128i *in1_local;
  
  lVar1 = (*in1)[0];
  lVar2 = (*in1)[1];
  lVar3 = (*in2)[1];
  (*out)[2] = (*in2)[0];
  (*out)[3] = lVar3;
  (*out)[0] = lVar1;
  (*out)[1] = lVar2;
  lVar1 = in1[1][0];
  lVar2 = in1[1][1];
  lVar3 = in2[1][1];
  out[1][2] = in2[1][0];
  out[1][3] = lVar3;
  out[1][0] = lVar1;
  out[1][1] = lVar2;
  lVar1 = in1[2][0];
  lVar2 = in1[2][1];
  lVar3 = in2[2][1];
  out[2][2] = in2[2][0];
  out[2][3] = lVar3;
  out[2][0] = lVar1;
  out[2][1] = lVar2;
  lVar1 = in1[3][0];
  lVar2 = in1[3][1];
  lVar3 = in2[3][1];
  out[3][2] = in2[3][0];
  out[3][3] = lVar3;
  out[3][0] = lVar1;
  out[3][1] = lVar2;
  lVar1 = in1[4][0];
  lVar2 = in1[4][1];
  lVar3 = in2[4][1];
  out[4][2] = in2[4][0];
  out[4][3] = lVar3;
  out[4][0] = lVar1;
  out[4][1] = lVar2;
  lVar1 = in1[5][0];
  lVar2 = in1[5][1];
  lVar3 = in2[5][1];
  out[5][2] = in2[5][0];
  out[5][3] = lVar3;
  out[5][0] = lVar1;
  out[5][1] = lVar2;
  lVar1 = in1[6][0];
  lVar2 = in1[6][1];
  lVar3 = in2[6][1];
  out[6][2] = in2[6][0];
  out[6][3] = lVar3;
  out[6][0] = lVar1;
  out[6][1] = lVar2;
  alVar4._0_16_ = ZEXT116(0) * (undefined1  [16])in2[7] + ZEXT116(1) * (undefined1  [16])in1[7];
  alVar4._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])in2[7];
  out[7] = alVar4;
  return;
}

Assistant:

static inline void pack_reg(const __m128i *in1, const __m128i *in2,
                            __m256i *out) {
  out[0] = _mm256_insertf128_si256(_mm256_castsi128_si256(in1[0]), in2[0], 0x1);
  out[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(in1[1]), in2[1], 0x1);
  out[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(in1[2]), in2[2], 0x1);
  out[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(in1[3]), in2[3], 0x1);
  out[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(in1[4]), in2[4], 0x1);
  out[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(in1[5]), in2[5], 0x1);
  out[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(in1[6]), in2[6], 0x1);
  out[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(in1[7]), in2[7], 0x1);
}